

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcSocket.cpp
# Opt level: O2

bool XmlRpc::XmlRpcSocket::nbRead(int fd,string *s,bool *eof)

{
  byte bVar1;
  bool bVar2;
  ssize_t sVar3;
  uint uVar4;
  double __x;
  char readBuf [4096];
  
  *eof = false;
  bVar1 = 0;
  while( true ) {
    while( true ) {
      if ((bVar1 & 1) != 0) {
        return true;
      }
      sVar3 = read(fd,readBuf,0xfff);
      XmlRpcUtil::log(__x);
      uVar4 = (uint)sVar3;
      if ((int)uVar4 < 1) break;
      readBuf[uVar4 & 0x7fffffff] = '\0';
      std::__cxx11::string::append((char *)s,(ulong)readBuf);
      bVar1 = *eof;
    }
    if (uVar4 != 0) break;
    *eof = true;
    bVar1 = 1;
  }
  bVar2 = nonFatalError();
  return bVar2;
}

Assistant:

bool XmlRpcSocket::nbRead(int fd, std::string& s, bool *eof)
{
  const int READ_SIZE = 4096;   // Number of bytes to attempt to read at a time
  char readBuf[READ_SIZE];

  bool wouldBlock = false;
  *eof = false;

  while ( ! wouldBlock && ! *eof) {
#if defined(_WIN32)
    int n = recv(fd, readBuf, READ_SIZE-1, 0);
#else
    int n = read(fd, readBuf, READ_SIZE-1);
#endif
    XmlRpcUtil::log(5, "XmlRpcSocket::nbRead: read/recv returned %d.", n);

    if (n > 0) {
      readBuf[n] = 0;
      s.append(readBuf, n);
    } else if (n == 0) {
      *eof = true;
    } else if (nonFatalError()) {
      wouldBlock = true;
    } else {
      return false;   // Error
    }
  }
  return true;
}